

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O2

bool trng::operator==(status_type *S1,status_type *S2)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x270) break;
    uVar1 = uVar2 + 1;
  } while (S1->mt[uVar2] == S2->mt[uVar2]);
  return 0x26f < uVar2;
}

Assistant:

bool operator==(const mt19937::status_type &S1, const mt19937::status_type &S2) {
    for (int i{0}; i < mt19937::status_type::N; ++i)
      if (S1.mt[i] != S2.mt[i])
        return false;
    return true;
  }